

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_shift_l(mbedtls_mpi *X,size_t count)

{
  mbedtls_mpi_uint *pmVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  
  sVar5 = mbedtls_mpi_bitlen(X);
  uVar6 = sVar5 + count;
  if ((X->n << 6 < uVar6) &&
     (iVar4 = mbedtls_mpi_grow(X,((uVar6 >> 6) + 1) - (ulong)((uVar6 & 0x3f) == 0)), iVar4 != 0)) {
    return iVar4;
  }
  uVar6 = count >> 6;
  bVar3 = (byte)count & 0x3f;
  if (0x3f < count) {
    uVar7 = X->n;
    if (uVar6 < uVar7) {
      pmVar1 = X->p;
      do {
        pmVar1[uVar7 - 1] = pmVar1[(uVar7 - 1) - uVar6];
        uVar7 = uVar7 - 1;
      } while (uVar6 < uVar7);
    }
    if (uVar7 != 0) {
      memset(X->p,0,uVar7 << 3);
    }
  }
  if (((count & 0x3f) != 0) && (uVar6 < X->n)) {
    pmVar1 = X->p;
    uVar7 = 0;
    do {
      uVar2 = pmVar1[uVar6];
      pmVar1[uVar6] = uVar2 << bVar3 | uVar7;
      uVar6 = uVar6 + 1;
      uVar7 = uVar2 >> (0x40 - bVar3 & 0x3f);
    } while (uVar6 < X->n);
  }
  return 0;
}

Assistant:

int mbedtls_mpi_shift_l( mbedtls_mpi *X, size_t count )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, v0, t1;
    mbedtls_mpi_uint r0 = 0, r1;
    MPI_VALIDATE_RET( X != NULL );

    v0 = count / (biL    );
    t1 = count & (biL - 1);

    i = mbedtls_mpi_bitlen( X ) + count;

    if( X->n * biL < i )
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, BITS_TO_LIMBS( i ) ) );

    ret = 0;

    /*
     * shift by count / limb_size
     */
    if( v0 > 0 )
    {
        for( i = X->n; i > v0; i-- )
            X->p[i - 1] = X->p[i - v0 - 1];

        for( ; i > 0; i-- )
            X->p[i - 1] = 0;
    }

    /*
     * shift by count % limb_size
     */
    if( t1 > 0 )
    {
        for( i = v0; i < X->n; i++ )
        {
            r1 = X->p[i] >> (biL - t1);
            X->p[i] <<= t1;
            X->p[i] |= r0;
            r0 = r1;
        }
    }

cleanup:

    return( ret );
}